

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

void __thiscall QToolBarPrivate::initDrag(QToolBarPrivate *this,QPoint *pos)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  bool bVar2;
  QMainWindow *mainWindow;
  QMainWindowLayout *pQVar3;
  DragState *pDVar4;
  QPoint QVar5;
  
  if (this->state != (DragState *)0x0) {
    return;
  }
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  mainWindow = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                         (*(QObject **)&(this->super_QWidgetPrivate).field_0x10);
  pQVar3 = qt_mainwindow_layout(mainWindow);
  if (pQVar3->pluggingWidget == (QWidget *)0x0) {
    pDVar4 = (DragState *)operator_new(0x18);
    this->state = pDVar4;
    pDVar4->pressPos = *pos;
    pDVar4->dragging = false;
    pDVar4->moving = false;
    pDVar4->widgetItem = (QLayoutItem *)0x0;
    bVar2 = QWidget::isRightToLeft(this_00);
    if (bVar2) {
      pQVar1 = this_00->data;
      pDVar4 = this->state;
      QVar5.xp.m_i = ((pQVar1->crect).x2.m_i - ((pQVar1->crect).x1.m_i + (pDVar4->pressPos).xp.m_i))
                     + 1;
      QVar5.yp.m_i = (pDVar4->pressPos).yp.m_i;
      pDVar4->pressPos = QVar5;
    }
  }
  return;
}

Assistant:

void QToolBarPrivate::initDrag(const QPoint &pos)
{
    Q_Q(QToolBar);

    if (state != nullptr)
        return;

    QMainWindow *win = qobject_cast<QMainWindow*>(parent);
    Q_ASSERT(win != nullptr);
    QMainWindowLayout *layout = qt_mainwindow_layout(win);
    Q_ASSERT(layout != nullptr);
    if (layout->pluggingWidget != nullptr) // the main window is animating a docking operation
        return;

    state = new DragState;
    state->pressPos = pos;
    state->dragging = false;
    state->moving = false;
    state->widgetItem = nullptr;

    if (q->isRightToLeft())
        state->pressPos = QPoint(q->width() - state->pressPos.x(), state->pressPos.y());
}